

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O1

BayesianProbitRegressor_Gaussian * __thiscall
CoreML::Specification::BayesianProbitRegressor_Gaussian::New
          (BayesianProbitRegressor_Gaussian *this,Arena *arena)

{
  BayesianProbitRegressor_Gaussian *this_00;
  
  this_00 = (BayesianProbitRegressor_Gaussian *)operator_new(0x28);
  BayesianProbitRegressor_Gaussian(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::BayesianProbitRegressor_Gaussian>
              (arena,this_00);
  }
  return this_00;
}

Assistant:

BayesianProbitRegressor_Gaussian* BayesianProbitRegressor_Gaussian::New(::google::protobuf::Arena* arena) const {
  BayesianProbitRegressor_Gaussian* n = new BayesianProbitRegressor_Gaussian;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}